

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

void __thiscall CoreML::Model::Model(Model *this)

{
  __shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  this->_vptr_Model = (_func_int **)&PTR__Model_0039e9a8;
  (this->m_spec).super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_spec).super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<CoreML::Specification::Model>();
  std::__shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_spec).
              super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>,&local_20
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  ((this->m_spec).super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr)->specificationversion_ = 7;
  return;
}

Assistant:

Model::Model() {
        m_spec = std::make_shared<Specification::Model>();
        m_spec->set_specificationversion(MLMODEL_SPECIFICATION_VERSION);
    }